

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::VariablePushPop::VariablePushPop(VariablePushPop *this,cmMakefile *m)

{
  cmMakefile *pcVar1;
  cmState *this_00;
  cmStateSnapshot local_30;
  cmMakefile *local_18;
  cmMakefile *m_local;
  VariablePushPop *this_local;
  
  this->Makefile = m;
  local_18 = m;
  m_local = (cmMakefile *)this;
  this_00 = GetState(this->Makefile);
  cmState::CreateVariableScopeSnapshot(&local_30,this_00,&this->Makefile->StateSnapshot);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).State = local_30.State;
  (pcVar1->StateSnapshot).Position.Tree = local_30.Position.Tree;
  (pcVar1->StateSnapshot).Position.Position = local_30.Position.Position;
  return;
}

Assistant:

cmMakefile::VariablePushPop::VariablePushPop(cmMakefile* m)
  : Makefile(m)
{
  this->Makefile->StateSnapshot =
    this->Makefile->GetState()->CreateVariableScopeSnapshot(
      this->Makefile->StateSnapshot);
}